

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::BasicTexSubImage2DCase::createTexture(BasicTexSubImage2DCase *this)

{
  deUint32 dVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  deUint32 dVar6;
  int width;
  int height;
  char *str;
  void *pvVar7;
  int local_204;
  PixelBufferAccess local_1f8;
  PixelBufferAccess local_1d0;
  int local_1a8;
  int cellSize;
  Vector<float,_4> local_194;
  undefined1 local_184 [8];
  Vec4 colorB;
  Vector<float,_4> local_164;
  undefined1 local_154 [8];
  Vec4 colorA;
  int y;
  int x;
  int h;
  int w;
  int levelH_1;
  int levelW_1;
  int ndx_1;
  PixelBufferAccess local_100;
  Vector<float,_4> local_d8;
  Vector<float,_4> local_c8;
  undefined1 local_b8 [8];
  Vec4 gMax;
  Vector<float,_4> local_98;
  undefined1 local_88 [8];
  Vec4 gMin;
  int levelH;
  int levelW;
  int ndx;
  undefined1 local_60 [8];
  Random rnd;
  TextureLevel data;
  deUint32 tex;
  int numLevels;
  TextureFormat fmt;
  BasicTexSubImage2DCase *this_local;
  
  _tex = (this->super_TextureSpecCase).m_texFormat;
  fmt = (TextureFormat)this;
  if (((this->super_TextureSpecCase).m_flags & 1) == 0) {
    local_204 = 1;
  }
  else {
    iVar4 = deLog2Floor32((this->super_TextureSpecCase).m_width);
    iVar5 = deLog2Floor32((this->super_TextureSpecCase).m_height);
    local_204 = de::max<int>(iVar4,iVar5);
    local_204 = local_204 + 1;
  }
  data.m_data.m_cap._4_4_ = local_204;
  data.m_data.m_cap._0_4_ = 0;
  tcu::TextureLevel::TextureLevel((TextureLevel *)&rnd.m_rnd.z,(TextureFormat *)&tex);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar6 = deStringHash(str);
  de::Random::Random((Random *)local_60,dVar6);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_TextureSpecCase).super_ContextWrapper,1,(deUint32 *)&data.m_data.m_cap);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_TextureSpecCase).super_ContextWrapper,0xde1,(deUint32)data.m_data.m_cap);
  sglr::ContextWrapper::glPixelStorei(&(this->super_TextureSpecCase).super_ContextWrapper,0xcf5,1);
  for (levelH = 0; levelH < data.m_data.m_cap._4_4_; levelH = levelH + 1) {
    gMin.m_data[3] =
         (float)de::max<int>(1,(this->super_TextureSpecCase).m_width >> ((byte)levelH & 0x1f));
    gMin.m_data[2] =
         (float)de::max<int>(1,(this->super_TextureSpecCase).m_height >> ((byte)levelH & 0x1f));
    tcu::Vector<float,_4>::Vector(&local_98,0.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(gMax.m_data + 2),1.0);
    randomVector<4>((Functional *)local_88,(Random *)local_60,&local_98,
                    (Vector<float,_4> *)(gMax.m_data + 2));
    tcu::Vector<float,_4>::Vector(&local_c8,0.0);
    tcu::Vector<float,_4>::Vector(&local_d8,1.0);
    randomVector<4>((Functional *)local_b8,(Random *)local_60,&local_c8,&local_d8);
    tcu::TextureLevel::setSize
              ((TextureLevel *)&rnd.m_rnd.z,(int)gMin.m_data[3],(int)gMin.m_data[2],1);
    tcu::TextureLevel::getAccess(&local_100,(TextureLevel *)&rnd.m_rnd.z);
    tcu::fillWithComponentGradients(&local_100,(Vec4 *)local_88,(Vec4 *)local_b8);
    fVar3 = gMin.m_data[3];
    fVar2 = gMin.m_data[2];
    dVar6 = this->m_format;
    dVar1 = this->m_dataType;
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&levelW_1,(TextureLevel *)&rnd.m_rnd.z);
    pvVar7 = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)&levelW_1);
    sglr::ContextWrapper::glTexImage2D
              (&(this->super_TextureSpecCase).super_ContextWrapper,0xde1,levelH,dVar6,(int)fVar3,
               (int)fVar2,0,dVar6,dVar1,pvVar7);
  }
  for (levelH_1 = 0; levelH_1 < data.m_data.m_cap._4_4_; levelH_1 = levelH_1 + 1) {
    iVar4 = de::max<int>(1,(this->super_TextureSpecCase).m_width >> ((byte)levelH_1 & 0x1f));
    iVar5 = de::max<int>(1,(this->super_TextureSpecCase).m_height >> ((byte)levelH_1 & 0x1f));
    width = de::Random::getInt((Random *)local_60,1,iVar4);
    height = de::Random::getInt((Random *)local_60,1,iVar5);
    colorA.m_data[3] = (float)de::Random::getInt((Random *)local_60,0,iVar4 - width);
    colorA.m_data[2] = (float)de::Random::getInt((Random *)local_60,0,iVar5 - height);
    tcu::Vector<float,_4>::Vector(&local_164,0.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colorB.m_data + 2),1.0);
    randomVector<4>((Functional *)local_154,(Random *)local_60,&local_164,
                    (Vector<float,_4> *)(colorB.m_data + 2));
    tcu::Vector<float,_4>::Vector(&local_194,0.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xfffffffffffffe5c,1.0);
    randomVector<4>((Functional *)local_184,(Random *)local_60,&local_194,
                    (Vector<float,_4> *)&stack0xfffffffffffffe5c);
    local_1a8 = de::Random::getInt((Random *)local_60,2,0x10);
    tcu::TextureLevel::setSize((TextureLevel *)&rnd.m_rnd.z,width,height,1);
    tcu::TextureLevel::getAccess(&local_1d0,(TextureLevel *)&rnd.m_rnd.z);
    tcu::fillWithGrid(&local_1d0,local_1a8,(Vec4 *)local_154,(Vec4 *)local_184);
    fVar3 = colorA.m_data[3];
    fVar2 = colorA.m_data[2];
    dVar6 = this->m_format;
    dVar1 = this->m_dataType;
    tcu::TextureLevel::getAccess(&local_1f8,(TextureLevel *)&rnd.m_rnd.z);
    pvVar7 = tcu::PixelBufferAccess::getDataPtr(&local_1f8);
    sglr::ContextWrapper::glTexSubImage2D
              (&(this->super_TextureSpecCase).super_ContextWrapper,0xde1,levelH_1,(int)fVar3,
               (int)fVar2,width,height,dVar6,dVar1,pvVar7);
  }
  de::Random::~Random((Random *)local_60);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&rnd.m_rnd.z);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		int					numLevels	= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32			tex			= 0;
		tcu::TextureLevel	data		(fmt);
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		// First specify full texture.
		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			Vec4	gMin		= randomVector<4>(rnd);
			Vec4	gMax		= randomVector<4>(rnd);

			data.setSize(levelW, levelH);
			tcu::fillWithComponentGradients(data.getAccess(), gMin, gMax);

			glTexImage2D(GL_TEXTURE_2D, ndx, m_format, levelW, levelH, 0, m_format, m_dataType, data.getAccess().getDataPtr());
		}

		// Re-specify parts of each level.
		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			int		w			= rnd.getInt(1, levelW);
			int		h			= rnd.getInt(1, levelH);
			int		x			= rnd.getInt(0, levelW-w);
			int		y			= rnd.getInt(0, levelH-h);

			Vec4	colorA		= randomVector<4>(rnd);
			Vec4	colorB		= randomVector<4>(rnd);
			int		cellSize	= rnd.getInt(2, 16);

			data.setSize(w, h);
			tcu::fillWithGrid(data.getAccess(), cellSize, colorA, colorB);

			glTexSubImage2D(GL_TEXTURE_2D, ndx, x, y, w, h, m_format, m_dataType, data.getAccess().getDataPtr());
		}
	}